

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>_> *this,TPZVec<long> *nodeindices
          ,int matind,TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016cbb08;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016c63e8,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016c60e8;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend(&this->fGeo,nodeindices);
  lVar1 = 0x2300;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoCube.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
     lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoCube.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoCube + -1) + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2588);
  for (lVar1 = 0x2300; lVar1 != 0x2588; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoCube + -1) + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoCube.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}